

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::RemoveAt(BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,int i,int last,uint targetBucket)

{
  int iVar1;
  Type pSVar2;
  
  pSVar2 = this->entries;
  iVar1 = pSVar2[i].
          super_DefaultHashedEntry<Js::ScriptContext_*,_FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<Js::ScriptContext_*,_FinalizableObject_*>.
          super_ValueEntry<FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>_>
          .super_KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>.next;
  if (last < 0) {
    this->buckets[targetBucket] = iVar1;
  }
  else {
    pSVar2[(uint)last].
    super_DefaultHashedEntry<Js::ScriptContext_*,_FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    .super_KeyValueEntry<Js::ScriptContext_*,_FinalizableObject_*>.
    super_ValueEntry<FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>_>
    .super_KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>.next = iVar1;
  }
  pSVar2[i].
  super_DefaultHashedEntry<Js::ScriptContext_*,_FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  .super_KeyValueEntry<Js::ScriptContext_*,_FinalizableObject_*>.
  super_ValueEntry<FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>_>
  .super_KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>.value =
       (FinalizableObject *)0x0;
  pSVar2[i].
  super_DefaultHashedEntry<Js::ScriptContext_*,_FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  .super_KeyValueEntry<Js::ScriptContext_*,_FinalizableObject_*>.
  super_ValueEntry<FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>_>
  .super_KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>.key =
       (ScriptContext *)0x0;
  SetNextFreeEntryIndex(this,this->entries + i,-(uint)(this->freeCount == 0) | this->freeList);
  this->freeList = i;
  this->freeCount = this->freeCount + 1;
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Remove(this->stats,this->buckets[targetBucket] == -1);
    return;
  }
  return;
}

Assistant:

inline void RemoveAt(const int i, const int last, const uint targetBucket)
        {
            if (last < 0)
            {
                buckets[targetBucket] = entries[i].next;
            }
            else
            {
                entries[last].next = entries[i].next;
            }
            entries[i].Clear();
            SetNextFreeEntryIndex(entries[i], freeCount == 0 ? -1 : freeList);
            freeList = i;
            freeCount++;
#if PROFILE_DICTIONARY
            if (stats)
                stats->Remove(buckets[targetBucket] == -1);
#endif
        }